

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNTree.cc
# Opt level: O3

QPDFObjectHandle __thiscall
NNTreeIterator::getNextKid(NNTreeIterator *this,PathElement *pe,bool backward)

{
  int iVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  QPDF *qpdf;
  uint __val;
  _Alloc_hider _Var3;
  size_type sVar4;
  uint uVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  uint uVar9;
  string *key;
  long *plVar10;
  int in_ECX;
  ulong uVar11;
  size_type *psVar12;
  undefined7 in_register_00000011;
  string *key_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  uint __len;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  uint uVar15;
  QPDFObjectHandle QVar16;
  QPDFObjectHandle kids;
  string local_98;
  NNTreeIterator *local_78;
  uint local_6c;
  PathElement *local_68;
  long *local_60 [2];
  long local_50 [2];
  QPDFObjectHandle local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var13;
  
  key_00 = (string *)CONCAT71(in_register_00000011,backward);
  this->_vptr_NNTreeIterator = (_func_int **)0x0;
  this->impl = (NNTreeImpl *)0x0;
  uVar15 = -in_ECX | 1;
  local_78 = this;
  local_6c = uVar15;
  local_68 = pe;
  do {
    paVar14 = &local_98.field_2;
    *(uint *)&key_00->field_2 = *(int *)&key_00->field_2 + uVar15;
    local_98._M_dataplus._M_p = (pointer)paVar14;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"/Kids","");
    QPDFObjectHandle::getKey(&local_40,key_00);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar14) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    iVar1 = *(int *)&key_00->field_2;
    if (iVar1 < 0) {
LAB_0012d46c:
      QVar16 = QPDFObjectHandle::newNull();
      sVar4 = local_98._M_string_length;
      _Var3._M_p = local_98._M_dataplus._M_p;
      _Var13._M_pi = QVar16.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      local_98._M_dataplus._M_p = (pointer)0x0;
      local_98._M_string_length = 0;
      p_Var2 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->impl)->_M_pi;
      (((BaseHandle *)&this->_vptr_NNTreeIterator)->obj).
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)_Var3._M_p
      ;
      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->impl)->_M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar4;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
        _Var13._M_pi = extraout_RDX_02;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._M_string_length);
          _Var13._M_pi = extraout_RDX_03;
        }
      }
      bVar6 = true;
    }
    else {
      iVar8 = QPDFObjectHandle::getArrayNItems(&local_40);
      if (iVar8 <= iVar1) goto LAB_0012d46c;
      QPDFObjectHandle::getArrayItem((QPDFObjectHandle *)&local_98,(int)&local_40);
      sVar4 = local_98._M_string_length;
      _Var3._M_p = local_98._M_dataplus._M_p;
      local_98._M_dataplus._M_p = (pointer)0x0;
      local_98._M_string_length = 0;
      p_Var2 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->impl)->_M_pi;
      (((BaseHandle *)&this->_vptr_NNTreeIterator)->obj).
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)_Var3._M_p
      ;
      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->impl)->_M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar4;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._M_string_length);
        }
      }
      bVar6 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)this);
      if (bVar6) {
        local_98._M_dataplus._M_p = (pointer)paVar14;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"/Kids","");
        bVar6 = QPDFObjectHandle::hasKey((QPDFObjectHandle *)this,&local_98);
        bVar7 = true;
        _Var13._M_pi = extraout_RDX;
        if (!bVar6) {
          key = (string *)
                (**(code **)*((local_68->node).super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                             ._M_pi)->_vptr__Sp_counted_base)();
          bVar7 = QPDFObjectHandle::hasKey((QPDFObjectHandle *)this,key);
          _Var13._M_pi = extraout_RDX_00;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != paVar14) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          _Var13._M_pi = extraout_RDX_01;
        }
        bVar6 = true;
        if (bVar7 == false) goto LAB_0012d418;
      }
      else {
LAB_0012d418:
        uVar15 = *(uint *)&key_00->field_2;
        __val = -uVar15;
        if (0 < (int)uVar15) {
          __val = uVar15;
        }
        __len = 1;
        if (9 < __val) {
          uVar11 = (ulong)__val;
          uVar5 = 4;
          do {
            __len = uVar5;
            uVar9 = (uint)uVar11;
            if (uVar9 < 100) {
              __len = __len - 2;
              goto LAB_0012d4ae;
            }
            if (uVar9 < 1000) {
              __len = __len - 1;
              goto LAB_0012d4ae;
            }
            if (uVar9 < 10000) goto LAB_0012d4ae;
            uVar11 = uVar11 / 10000;
            uVar5 = __len + 4;
          } while (99999 < uVar9);
          __len = __len + 1;
        }
LAB_0012d4ae:
        qpdf = *(QPDF **)&((local_68->node).super_BaseHandle.obj.
                           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                          _M_pi)->_M_use_count;
        local_60[0] = local_50;
        std::__cxx11::string::_M_construct
                  ((ulong)local_60,(char)__len - (char)((int)uVar15 >> 0x1f));
        std::__detail::__to_chars_10_impl<unsigned_int>
                  ((char *)((ulong)(uVar15 >> 0x1f) + (long)local_60[0]),__len,__val);
        plVar10 = (long *)std::__cxx11::string::replace((ulong)local_60,0,(char *)0x0,0x261408);
        uVar15 = local_6c;
        this = local_78;
        psVar12 = (size_type *)(plVar10 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar12) {
          local_98.field_2._M_allocated_capacity = *psVar12;
          local_98.field_2._8_8_ = plVar10[3];
          local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        }
        else {
          local_98.field_2._M_allocated_capacity = *psVar12;
          local_98._M_dataplus._M_p = (pointer)*plVar10;
        }
        local_98._M_string_length = plVar10[1];
        *plVar10 = (long)psVar12;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        warn(qpdf,(QPDFObjectHandle *)key_00,&local_98);
        _Var13._M_pi = extraout_RDX_04;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          _Var13._M_pi = extraout_RDX_05;
        }
        if (local_60[0] != local_50) {
          operator_delete(local_60[0],local_50[0] + 1);
          _Var13._M_pi = extraout_RDX_06;
        }
        bVar6 = false;
      }
    }
    if (local_40.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_40.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      _Var13._M_pi = extraout_RDX_07;
    }
    if (bVar6) {
      QVar16.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = _Var13._M_pi;
      QVar16.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = (element_type *)this;
      return (QPDFObjectHandle)
             QVar16.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
    }
  } while( true );
}

Assistant:

QPDFObjectHandle
NNTreeIterator::getNextKid(PathElement& pe, bool backward)
{
    QPDFObjectHandle result;
    bool found = false;
    while (!found) {
        pe.kid_number += backward ? -1 : 1;
        auto kids = pe.node.getKey("/Kids");
        if ((pe.kid_number >= 0) && (pe.kid_number < kids.getArrayNItems())) {
            result = kids.getArrayItem(pe.kid_number);
            if (result.isDictionary() &&
                (result.hasKey("/Kids") || result.hasKey(impl.details.itemsKey()))) {
                found = true;
            } else {
                QTC::TC("qpdf", "NNTree skip invalid kid");
                warn(
                    impl.qpdf,
                    pe.node,
                    ("skipping over invalid kid at index " + std::to_string(pe.kid_number)));
            }
        } else {
            result = QPDFObjectHandle::newNull();
            found = true;
        }
    }
    return result;
}